

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3PagerUnrefNotNull(DbPage *pPg)

{
  i16 *piVar1;
  Pager *pPVar2;
  PCache *pPVar3;
  
  if ((pPg->flags & 0x20) != 0) {
    pPVar2 = pPg->pPager;
    pPVar2->nMmapOut = pPVar2->nMmapOut + -1;
    pPg->pDirty = pPVar2->pMmapFreelist;
    pPVar2->pMmapFreelist = pPg;
    (*pPVar2->fd->pMethods->xUnfetch)
              (pPVar2->fd,(ulong)(pPg->pgno - 1) * pPVar2->pageSize,pPg->pData);
    return;
  }
  pPVar3 = pPg->pCache;
  pPVar3->nRefSum = pPVar3->nRefSum + -1;
  piVar1 = &pPg->nRef;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    if ((pPg->flags & 1) == 0) {
      pcacheManageDirtyList(pPg,'\x03');
      return;
    }
    if (pPVar3->bPurgeable != '\0') {
      (*sqlite3Config.pcache2.xUnpin)(pPVar3->pCache,pPg->pPage,0);
      return;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3PagerUnrefNotNull(DbPage *pPg){
  TESTONLY( Pager *pPager = pPg->pPager; )
  assert( pPg!=0 );
  if( pPg->flags & PGHDR_MMAP ){
    assert( pPg->pgno!=1 );  /* Page1 is never memory mapped */
    pagerReleaseMapPage(pPg);
  }else{
    sqlite3PcacheRelease(pPg);
  }
  /* Do not use this routine to release the last reference to page1 */
  assert( sqlite3PcacheRefCount(pPager->pPCache)>0 );
}